

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseValue
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this)

{
  ulong uVar1;
  bool bVar2;
  __int128 *p_Var3;
  error *peVar4;
  byte bVar5;
  uint *this_00;
  string local_40;
  
  eatSpaces((ExpressionParser<__int128> *)__return_storage_ptr__);
  uVar1 = *(ulong *)(__return_storage_ptr__ + 2);
  if (uVar1 < *(ulong *)((long)__return_storage_ptr__ + 8)) {
    bVar5 = *(byte *)((long)*__return_storage_ptr__ + uVar1);
  }
  else {
    bVar5 = 0;
  }
  this_00 = &switchD_00118f64::switchdataD_00153078;
  switch(bVar5) {
  case 0x28:
    *(ulong *)(__return_storage_ptr__ + 2) = uVar1 + 1;
    p_Var3 = parseExpr(__return_storage_ptr__,
                       (ExpressionParser<__int128> *)&switchD_00118f64::switchdataD_00153078);
    eatSpaces((ExpressionParser<__int128> *)__return_storage_ptr__);
    uVar1 = *(ulong *)(__return_storage_ptr__ + 2);
    if ((*(ulong *)((long)__return_storage_ptr__ + 8) <= uVar1) ||
       (*(char *)((long)*__return_storage_ptr__ + uVar1) != ')')) {
      if (uVar1 < *(ulong *)((long)__return_storage_ptr__ + 8)) {
        unexpected((ExpressionParser<__int128> *)__return_storage_ptr__);
      }
      peVar4 = (error *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Syntax error: `)\' expected at end of expression","");
      error::error(peVar4,(string *)__return_storage_ptr__,&local_40);
      __cxa_throw(peVar4,&error::typeinfo,error::~error);
    }
    *(ulong *)(__return_storage_ptr__ + 2) = uVar1 + 1;
    break;
  case 0x29:
  case 0x2a:
  case 0x2c:
  case 0x2e:
  case 0x2f:
switchD_00118f64_caseD_29:
    if (uVar1 < *(ulong *)((long)__return_storage_ptr__ + 8)) {
      unexpected((ExpressionParser<__int128> *)__return_storage_ptr__);
    }
    peVar4 = (error *)__cxa_allocate_exception(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Syntax error: value expected at end of expression","");
    error::error(peVar4,(string *)__return_storage_ptr__,&local_40);
    __cxa_throw(peVar4,&error::typeinfo,error::~error);
  case 0x2b:
    *(ulong *)(__return_storage_ptr__ + 2) = uVar1 + 1;
    p_Var3 = parseValue(__return_storage_ptr__,
                        (ExpressionParser<__int128> *)&switchD_00118f64::switchdataD_00153078);
    break;
  case 0x2d:
    *(ulong *)(__return_storage_ptr__ + 2) = uVar1 + 1;
    p_Var3 = parseValue(__return_storage_ptr__,
                        (ExpressionParser<__int128> *)&switchD_00118f64::switchdataD_00153078);
    p_Var3 = (__int128 *)-(long)p_Var3;
    break;
  case 0x30:
    bVar2 = isHex((ExpressionParser<__int128> *)__return_storage_ptr__);
    if (bVar2) {
      p_Var3 = parseHex(__return_storage_ptr__,(ExpressionParser<__int128> *)this_00);
      return p_Var3;
    }
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    p_Var3 = parseDecimal(__return_storage_ptr__,(ExpressionParser<__int128> *)this_00);
    break;
  default:
    if (bVar5 != 0x7e) goto switchD_00118f64_caseD_29;
    *(ulong *)(__return_storage_ptr__ + 2) = uVar1 + 1;
    p_Var3 = parseValue(__return_storage_ptr__,(ExpressionParser<__int128> *)(ulong)bVar5);
    p_Var3 = (__int128 *)~(ulong)p_Var3;
  }
  return p_Var3;
}

Assistant:

T parseValue()
  {
    T val = 0;
    eatSpaces();
    switch (getCharacter())
    {
      case '0': if (isHex())
                  val = parseHex();
                else
                  val = parseDecimal();
                break;
      case '1': case '2': case '3': case '4': case '5':
      case '6': case '7': case '8': case '9':
                val = parseDecimal();
                break;
      case '(': index_++;
                val = parseExpr();
                eatSpaces();
                if (getCharacter() != ')')
                {
                  if (!isEnd())
                    unexpected();
                  throw calculator::error(expr_, "Syntax error: `)' expected at end of expression");
                }
                index_++; break;
      case '~': index_++; val = ~parseValue(); break;
      case '+': index_++; val =  parseValue(); break;
      case '-': index_++; val =  parseValue() * static_cast<T>(-1);
                break;
      default : if (!isEnd())
                  unexpected();
                throw calculator::error(expr_, "Syntax error: value expected at end of expression");
    }
    return val;
  }